

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

Expression * __thiscall soul::heart::Parser::parseExpression(Parser *this,FunctionParseState *state)

{
  SourceCodeText *o;
  ProgramImpl *pPVar1;
  bool bVar2;
  int iVar3;
  BinaryOperator *pBVar4;
  UnaryOperator *pUVar5;
  Expression *pEVar6;
  TypeCast *lhs;
  Constant *pCVar7;
  Op opType;
  Op opType_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  char *__s1;
  string name;
  pool_ptr<soul::heart::Variable> v;
  CodeLocation errorPos;
  undefined1 local_e8 [64];
  undefined1 local_a8 [88];
  CompileMessage local_50;
  
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"add");
  if (bVar2) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    opType = add;
  }
  else {
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,"subtract");
    if (bVar2) {
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip(&this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          );
      opType = subtract;
    }
    else {
      bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matches(&this->
                         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ,"multiply");
      if (bVar2) {
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::skip(&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              );
        opType = multiply;
      }
      else {
        bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matches(&this->
                           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                          ,"divide");
        if (bVar2) {
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::skip(&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                );
          opType = divide;
        }
        else {
          bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ::matches(&this->
                             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                            ,"modulo");
          if (bVar2) {
            Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::skip(&this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  );
            opType = modulo;
          }
          else {
            bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ::matches(&this->
                               super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                              ,"bitwiseOr");
            if (bVar2) {
              Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::skip(&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    );
              opType = bitwiseOr;
            }
            else {
              bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ::matches(&this->
                                 super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                ,"bitwiseAnd");
              if (bVar2) {
                Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::skip(&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      );
                opType = bitwiseAnd;
              }
              else {
                bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ::matches(&this->
                                   super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                  ,"bitwiseXor");
                if (bVar2) {
                  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ::skip(&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        );
                  opType = bitwiseXor;
                }
                else {
                  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                          ::matches(&this->
                                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                    ,"logicalOr");
                  if (bVar2) {
                    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ::skip(&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                          );
                    opType = logicalOr;
                  }
                  else {
                    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                            ::matches(&this->
                                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                      ,"logicalAnd");
                    if (bVar2) {
                      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ::skip(&this->
                              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                            );
                      opType = logicalAnd;
                    }
                    else {
                      bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                              ::matches(&this->
                                         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                        ,"equals");
                      if (bVar2) {
                        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ::skip(&this->
                                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                              );
                        opType = equals;
                      }
                      else {
                        bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                ::matches(&this->
                                           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                          ,"notEquals");
                        if (bVar2) {
                          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                          ::skip(&this->
                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                );
                          opType = notEquals;
                        }
                        else {
                          bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                  ::matches(&this->
                                             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                            ,"lessThan");
                          if (bVar2) {
                            Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                            ::skip(&this->
                                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                  );
                            opType = lessThan;
                          }
                          else {
                            bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                    ::matches(&this->
                                               super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                              ,"lessThanOrEqual");
                            if (bVar2) {
                              Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                              ::skip(&this->
                                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                    );
                              opType = lessThanOrEqual;
                            }
                            else {
                              bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                      ::matches(&this->
                                                 super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                ,"greaterThan");
                              if (bVar2) {
                                Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                ::skip(&this->
                                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                      );
                                opType = greaterThan;
                              }
                              else {
                                bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                        ::matches(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ,"greaterThanOrEqual");
                                if (bVar2) {
                                  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                  ::skip(&this->
                                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                        );
                                  opType = greaterThanOrEqual;
                                }
                                else {
                                  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                          ::matches(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ,"leftShift");
                                  if (bVar2) {
                                    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                    ::skip(&this->
                                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                          );
                                    opType = leftShift;
                                  }
                                  else {
                                    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                            ::matches(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ,"rightShift");
                                    if (bVar2) {
                                      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                      ::skip(&this->
                                              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                            );
                                      opType = rightShift;
                                    }
                                    else {
                                      bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                              ::matches(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ,"rightShiftUnsigned");
                                      if (!bVar2) {
                                        bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                ::matches(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ,"negate");
                                        if (bVar2) {
                                          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                          ::skip(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                );
                                          opType_00 = negate;
                                        }
                                        else {
                                          bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ::matches(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ,"logicalNot");
                                          if (bVar2) {
                                            Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                            ::skip(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  );
                                            opType_00 = logicalNot;
                                          }
                                          else {
                                            bVar2 = 
                                                  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ::matches(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ,"bitwiseNot");
                                            if (!bVar2) {
                                              __s1 = (this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ).currentType.text;
                                              if (__s1 == "$variableIdentifier") {
LAB_0024a396:
                                                o = (this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ).location.sourceCode.object;
                                                if (o != (SourceCodeText *)0x0) {
                                                  (o->super_RefCountedObject).refCount =
                                                       (o->super_RefCountedObject).refCount + 1;
                                                }
                                                local_a8._16_8_ =
                                                     (this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ).location.location.data;
                                                local_a8._8_8_ = o;
                                                readQualifiedVariableIdentifier_abi_cxx11_
                                                          ((string *)local_e8,this);
                                                findVariable((Parser *)local_a8,
                                                             (FunctionParseState *)this,
                                                             (string *)state);
                                                if ((Expression *)local_a8._0_8_ ==
                                                    (Expression *)0x0) {
                                                  CompileMessageHelpers::
                                                  createMessage<std::__cxx11::string&>
                                                            (&local_50,(CompileMessageHelpers *)0x1,
                                                             none,0x2a0dcc,local_e8,in_R9);
                                                  CodeLocation::throwError
                                                            ((CodeLocation *)(local_a8 + 8),
                                                             &local_50);
                                                }
                                                pEVar6 = parseSuffixOperators
                                                                   (this,state,
                                                                    (Expression *)local_a8._0_8_);
                                                if ((undefined1 *)
                                                    CONCAT71(local_e8._1_7_,local_e8[0]) !=
                                                    local_e8 + 0x10) {
                                                  operator_delete((undefined1 *)
                                                                  CONCAT71(local_e8._1_7_,
                                                                           local_e8[0]),
                                                                  CONCAT71(local_e8._17_7_,
                                                                           local_e8[0x10]) + 1);
                                                }
                                                RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o)
                                                ;
                                                return pEVar6;
                                              }
                                              if (__s1 != (char *)0x0) {
                                                iVar3 = strcmp(__s1,"$variableIdentifier");
                                                if (iVar3 == 0) goto LAB_0024a396;
                                                if ((__s1 == "$identifier") ||
                                                   (iVar3 = strcmp(__s1,"$identifier"), iVar3 == 0))
                                                {
                                                  bVar2 = 
                                                  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ::matches(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ,"cast");
                                                  if (bVar2) {
                                                                                                        
                                                  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ::skip(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  );
                                                  lhs = parseCast(this,state);
                                                  pEVar6 = parseSuffixOperators
                                                                     (this,state,
                                                                      &lhs->super_Expression);
                                                  return pEVar6;
                                                  }
                                                  parseNaNandInfinityTokens((Value *)local_e8,this);
                                                  if (local_e8[0] != invalid) {
                                                    pPVar1 = (this->program).pimpl;
                                                    soul::Value::Value((Value *)(local_a8 + 0x18),
                                                                       (Value *)local_e8);
                                                    pCVar7 = Allocator::allocateConstant
                                                                       (&pPVar1->allocator,
                                                                        (Value *)(local_a8 + 0x18));
                                                    soul::Value::~Value((Value *)(local_a8 + 0x18));
LAB_0024a4fc:
                                                    soul::Value::~Value((Value *)local_e8);
                                                    return &pCVar7->super_Expression;
                                                  }
                                                  bVar2 = 
                                                  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ::matches(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ,"processor");
                                                  if (bVar2) {
                                                                                                        
                                                  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ::skip(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  );
                                                  pCVar7 = (Constant *)parseProcessorProperty(this);
                                                  goto LAB_0024a4fc;
                                                  }
                                                  soul::Value::~Value((Value *)local_e8);
                                                  __s1 = (this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  ).currentType.text;
                                                }
                                                if (__s1 == "$integer32") {
LAB_0024a4a2:
                                                  local_e8[0] = primitive;
                                                  local_e8[1] = invalid;
                                                  local_e8[2] = false;
                                                  local_e8[3] = false;
                                                  local_e8._4_4_ = int32;
                                                  local_e8[8] = 0;
                                                  local_e8._9_7_ = 0;
                                                  local_e8[0x10] = '\0';
                                                  local_e8._17_7_ = 0;
                                                  pEVar6 = parseConstantAsExpression
                                                                     (this,state,(Type *)local_e8);
                                                  RefCountedPtr<soul::Structure>::decIfNotNull
                                                            ((Structure *)
                                                             CONCAT71(local_e8._17_7_,local_e8[0x10]
                                                                     ));
                                                  return pEVar6;
                                                }
                                                if (__s1 != (char *)0x0) {
                                                  iVar3 = strcmp(__s1,"$integer32");
                                                  if (iVar3 == 0) goto LAB_0024a4a2;
                                                  if ((__s1 == "$integer64") ||
                                                     (iVar3 = strcmp(__s1,"$integer64"), iVar3 == 0)
                                                     ) {
                                                    local_e8[0] = primitive;
                                                    local_e8[1] = invalid;
                                                    local_e8[2] = false;
                                                    local_e8[3] = false;
                                                    local_e8._4_4_ = int64;
                                                    local_e8[8] = 0;
                                                    local_e8._9_7_ = 0;
                                                    local_e8[0x10] = '\0';
                                                    local_e8._17_7_ = 0;
                                                    pEVar6 = parseConstantAsExpression
                                                                       (this,state,(Type *)local_e8)
                                                    ;
                                                    RefCountedPtr<soul::Structure>::decIfNotNull
                                                              ((Structure *)
                                                               CONCAT71(local_e8._17_7_,
                                                                        local_e8[0x10]));
                                                    return pEVar6;
                                                  }
                                                  if ((__s1 == "$float32") ||
                                                     (iVar3 = strcmp(__s1,"$float32"), iVar3 == 0))
                                                  {
                                                    local_e8[0] = primitive;
                                                    local_e8[1] = invalid;
                                                    local_e8[2] = false;
                                                    local_e8[3] = false;
                                                    local_e8._4_4_ = float32;
                                                    local_e8[8] = 0;
                                                    local_e8._9_7_ = 0;
                                                    local_e8[0x10] = '\0';
                                                    local_e8._17_7_ = 0;
                                                    pEVar6 = parseConstantAsExpression
                                                                       (this,state,(Type *)local_e8)
                                                    ;
                                                    RefCountedPtr<soul::Structure>::decIfNotNull
                                                              ((Structure *)
                                                               CONCAT71(local_e8._17_7_,
                                                                        local_e8[0x10]));
                                                    return pEVar6;
                                                  }
                                                  if ((__s1 == "$float64") ||
                                                     (iVar3 = strcmp(__s1,"$float64"), iVar3 == 0))
                                                  {
                                                    local_e8[0] = primitive;
                                                    local_e8[1] = invalid;
                                                    local_e8[2] = false;
                                                    local_e8[3] = false;
                                                    local_e8._4_4_ = float64;
                                                    local_e8[8] = 0;
                                                    local_e8._9_7_ = 0;
                                                    local_e8[0x10] = '\0';
                                                    local_e8._17_7_ = 0;
                                                    pEVar6 = parseConstantAsExpression
                                                                       (this,state,(Type *)local_e8)
                                                    ;
                                                    RefCountedPtr<soul::Structure>::decIfNotNull
                                                              ((Structure *)
                                                               CONCAT71(local_e8._17_7_,
                                                                        local_e8[0x10]));
                                                    return pEVar6;
                                                  }
                                                  if ((__s1 == "$string literal") ||
                                                     (iVar3 = strcmp(__s1,"$string literal"),
                                                     iVar3 == 0)) {
                                                    local_e8[0] = stringLiteral;
                                                    local_e8[1] = invalid;
                                                    local_e8[2] = false;
                                                    local_e8[3] = false;
                                                    local_e8._4_4_ = invalid;
                                                    local_e8[8] = 0;
                                                    local_e8._9_7_ = 0;
                                                    local_e8[0x10] = '\0';
                                                    local_e8._17_7_ = 0;
                                                    pEVar6 = parseConstantAsExpression
                                                                       (this,state,(Type *)local_e8)
                                                    ;
                                                    RefCountedPtr<soul::Structure>::decIfNotNull
                                                              ((Structure *)
                                                               CONCAT71(local_e8._17_7_,
                                                                        local_e8[0x10]));
                                                    return pEVar6;
                                                  }
                                                }
                                              }
                                              readValueType((Type *)local_e8,this);
                                              pEVar6 = parseConstantAsExpression
                                                                 (this,state,(Type *)local_e8);
                                              RefCountedPtr<soul::Structure>::decIfNotNull
                                                        ((Structure *)
                                                         CONCAT71(local_e8._17_7_,local_e8[0x10]));
                                              return pEVar6;
                                            }
                                            Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                            ::skip(&this->
                                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                                  );
                                            opType_00 = bitwiseNot;
                                          }
                                        }
                                        pUVar5 = parseUnaryOp(this,state,opType_00);
                                        return &pUVar5->super_Expression;
                                      }
                                      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                      ::skip(&this->
                                              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                            );
                                      opType = rightShiftUnsigned;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pBVar4 = parseBinaryOp(this,state,opType);
  return &pBVar4->super_Expression;
}

Assistant:

heart::Expression& parseExpression (const FunctionParseState& state)
    {
        #define SOUL_MATCH_BINARY_OP_NAME(name, op) \
            if (matchIf (#name)) return parseBinaryOp (state, BinaryOp::Op::name);
        SOUL_BINARY_OPS (SOUL_MATCH_BINARY_OP_NAME)
        #undef SOUL_MATCH_BINARY_OP_NAME

        #define SOUL_COMPARE_UNARY_OP(name, op) \
            if (matchIf (#name)) return parseUnaryOp (state, UnaryOp::Op::name);
        SOUL_UNARY_OPS (SOUL_COMPARE_UNARY_OP)
        #undef SOUL_COMPARE_UNARY_OP

        if (matches (Token::variableIdentifier))
        {
            auto errorPos = location;
            auto name = readQualifiedVariableIdentifier();

            if (auto v = findVariable (state, name))
                return parseSuffixOperators (state, *v);

            errorPos.throwError (Errors::unresolvedSymbol (name));
        }

        if (matches (Token::identifier))
        {
            if (matchIf ("cast"))
                return parseSuffixOperators (state, parseCast (state));

            auto infOrNaN = parseNaNandInfinityTokens();

            if (infOrNaN.isValid())
                return program.getAllocator().allocateConstant (infOrNaN);

            if (matchIf ("processor"))
                return parseProcessorProperty();
        }

        if (matches (Token::literalInt32))       return parseConstantAsExpression (state, PrimitiveType::int32);
        if (matches (Token::literalInt64))       return parseConstantAsExpression (state, PrimitiveType::int64);
        if (matches (Token::literalFloat32))     return parseConstantAsExpression (state, PrimitiveType::float32);
        if (matches (Token::literalFloat64))     return parseConstantAsExpression (state, PrimitiveType::float64);
        if (matches (Token::literalString))      return parseConstantAsExpression (state, Type::createStringLiteral());

        return parseConstantAsExpression (state, readValueType());
    }